

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void * __thiscall
vector<NodeList<Node>_>::realloc(vector<NodeList<Node>_> *this,void *__ptr,size_t __size)

{
  NodeList<Node> *pNVar1;
  void *pvVar2;
  NodeList<Node> *in_RAX;
  ulong *puVar3;
  undefined8 *puVar4;
  vector<Node> *pvVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  uVar6 = 1;
  if (1 < (int)(uint)__ptr) {
    uVar6 = (uint)__ptr;
  }
  if (this->_capacity != uVar6) {
    uVar8 = (ulong)uVar6;
    puVar3 = (ulong *)operator_new__(uVar8 * 0x18 + 8);
    *puVar3 = uVar8;
    in_RAX = (NodeList<Node> *)(puVar3 + 1);
    lVar7 = 0;
    do {
      puVar4 = (undefined8 *)operator_new__(8);
      *puVar4 = 0;
      *(undefined8 **)((long)puVar3 + lVar7 + 8) = puVar4;
      *(undefined8 *)((long)puVar3 + lVar7 + 0x10) = 0x100000000;
      *(undefined4 *)((long)puVar3 + lVar7 + 0x18) = 0;
      lVar7 = lVar7 + 0x18;
    } while (uVar8 * 0x18 != lVar7);
    if (0 < this->_size) {
      pvVar5 = vector<Node>::operator=((vector<Node> *)in_RAX,&this->vect->nodes);
      for (; lVar7 != 0; lVar7 = lVar7 + -0x18) {
        pvVar2 = *(void **)((long)puVar3 + lVar7 + -0x10);
        if (pvVar2 != (void *)0x0) {
          operator_delete__(pvVar2);
        }
      }
      operator_delete__(puVar3);
      _Unwind_Resume(pvVar5);
    }
    this->_capacity = uVar6;
    pNVar1 = this->vect;
    if (pNVar1 != (NodeList<Node> *)0x0) {
      if (*(long *)&pNVar1[-1]._currNode != 0) {
        lVar7 = *(long *)&pNVar1[-1]._currNode * 0x18;
        do {
          pvVar2 = *(void **)((long)&pNVar1[-1].nodes.vect + lVar7);
          if (pvVar2 != (void *)0x0) {
            operator_delete__(pvVar2);
          }
          lVar7 = lVar7 + -0x18;
        } while (lVar7 != 0);
      }
      operator_delete__(&pNVar1[-1]._currNode);
    }
    this->vect = in_RAX;
  }
  return in_RAX;
}

Assistant:

inline T max(const T& a, const T& b) {
    return (a < b) ? b : a;
}